

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O0

void __thiscall cnn::MomentumSGDTrainer::update(MomentumSGDTrainer *this,real scale)

{
  uint uVar1;
  bool bVar2;
  reference ppPVar3;
  reference ppLVar4;
  reference puVar5;
  ulong uVar6;
  vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_> *in_RDI;
  float in_XMM0_Da;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  reg_1;
  Tensor *v_1;
  uint i;
  iterator __end2;
  iterator __begin2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *vx;
  LookupParameters *p_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *__range1_1;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  reg;
  Tensor *v;
  Parameters *p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *__range1;
  uint pi;
  float gscale;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
  *in_stack_fffffffffffffb18;
  Trainer *in_stack_fffffffffffffb20;
  vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
  *in_stack_fffffffffffffb30;
  Tensor *in_stack_fffffffffffffb38;
  LookupParameters *in_stack_fffffffffffffb40;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffb48;
  StorageBaseType *in_stack_fffffffffffffb50;
  float *in_stack_fffffffffffffb58;
  float *in_stack_fffffffffffffb60;
  Model *in_stack_fffffffffffffb68;
  _Node_iterator_base<unsigned_int,_false> local_2b8;
  _Node_iterator_base<unsigned_int,_false> local_2b0;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_2a8;
  reference local_2a0;
  LookupParameters *local_298;
  LookupParameters **local_290;
  __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
  local_288;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *local_280;
  float local_1c4;
  reference local_70;
  Parameters *local_68;
  Parameters **local_60;
  __normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
  local_58;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *local_50;
  uint local_48;
  float local_44;
  float local_c;
  
  local_c = in_XMM0_Da;
  if (((ulong)(((_Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)
               &in_RDI[2].
                super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
               )->_M_impl).super__Vector_impl_data._M_finish & 0x100000000) == 0) {
    AllocateShadowParameters(in_stack_fffffffffffffb68);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::operator=
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)
               in_stack_fffffffffffffb30,
               (vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)in_RDI);
    std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::~vector
              ((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)
               in_stack_fffffffffffffb30);
    AllocateShadowLookupParameters(in_stack_fffffffffffffb68);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::
    operator=(in_stack_fffffffffffffb30,in_RDI);
    std::vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::~vector
              (in_stack_fffffffffffffb30);
    *(undefined1 *)
     ((long)&(((_Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)
              &in_RDI[2].
               super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
              )->_M_impl).super__Vector_impl_data._M_finish + 4) = 1;
  }
  local_44 = Trainer::clip_gradients(in_stack_fffffffffffffb20);
  local_48 = 0;
  local_50 = Model::parameters_list
                       ((Model *)(((_Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>
                                    *)&in_RDI[2].
                                       super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                                  )->_M_impl).super__Vector_impl_data._M_start);
  local_58._M_current =
       (Parameters **)
       std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::begin
                 ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
                  in_stack_fffffffffffffb18);
  local_60 = (Parameters **)
             std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::end
                       ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
                        in_stack_fffffffffffffb18);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
                        *)in_stack_fffffffffffffb20,
                       (__normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
                        *)in_stack_fffffffffffffb18);
    if (!bVar2) break;
    ppPVar3 = __gnu_cxx::
              __normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
              ::operator*(&local_58);
    local_68 = *ppPVar3;
    uVar6 = (ulong)local_48;
    local_48 = local_48 + 1;
    local_70 = std::vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>::
               operator[]((vector<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)
                          &(((_Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>
                              *)&in_RDI[2].
                                 super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                            )->_M_impl).super__Vector_impl_data._M_end_of_storage,uVar6);
    Tensor::vec(in_stack_fffffffffffffb38);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator*
              ((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
    in_stack_fffffffffffffb20 =
         (Trainer *)
         &(((_Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)
           &in_RDI[2].
            super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
           )->_M_impl).super__Vector_impl_data._M_finish;
    Tensor::vec(in_stack_fffffffffffffb38);
    Eigen::operator*(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    local_1c4 = *(float *)((long)&(((_Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>
                                     *)&in_RDI->
                                        super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                                   )->_M_impl).super__Vector_impl_data._M_finish + 4) * local_c *
                local_44;
    Tensor::vec(in_stack_fffffffffffffb38);
    Eigen::operator*(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>
    ::operator-(in_stack_fffffffffffffb48,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                 *)in_stack_fffffffffffffb40);
    Tensor::vec(in_stack_fffffffffffffb38);
    Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
               in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    Tensor::vec(in_stack_fffffffffffffb38);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator-
              ((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffffb48,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
                *)in_stack_fffffffffffffb40);
    Tensor::vec(in_stack_fffffffffffffb38);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator+=
              ((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffffb40,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>
                *)in_stack_fffffffffffffb38);
    Parameters::clear((Parameters *)0x51358a);
    __gnu_cxx::
    __normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
    ::operator++(&local_58);
  }
  local_48 = 0;
  local_280 = Model::lookup_parameters_list
                        ((Model *)(((_Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>
                                     *)&in_RDI[2].
                                        super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                                   )->_M_impl).super__Vector_impl_data._M_start);
  local_288._M_current =
       (LookupParameters **)
       std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::begin
                 ((vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *)
                  in_stack_fffffffffffffb18);
  local_290 = (LookupParameters **)
              std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::end
                        ((vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                          *)in_stack_fffffffffffffb18);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                        *)in_stack_fffffffffffffb20,
                       (__normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                        *)in_stack_fffffffffffffb18);
    if (!bVar2) break;
    ppLVar4 = __gnu_cxx::
              __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
              ::operator*(&local_288);
    local_298 = *ppLVar4;
    uVar6 = (ulong)local_48;
    local_48 = local_48 + 1;
    local_2a0 = std::
                vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>::
                operator[]((vector<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                            *)&(((_Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_>
                                  *)&in_RDI[3].
                                     super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                                )->_M_impl).super__Vector_impl_data._M_end_of_storage,uVar6);
    local_2a8 = &local_298->non_zero_grads;
    local_2b0._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)in_stack_fffffffffffffb18);
    local_2b8._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)in_stack_fffffffffffffb18);
    while( true ) {
      bVar2 = std::__detail::operator!=(&local_2b0,&local_2b8);
      if (!bVar2) break;
      puVar5 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*
                         ((_Node_iterator<unsigned_int,_true,_false> *)0x5136b3);
      uVar1 = *puVar5;
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[](&local_2a0->h,(ulong)uVar1)
      ;
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                (&local_298->values,(ulong)uVar1);
      Tensor::vec(in_stack_fffffffffffffb38);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
      operator*((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
      in_stack_fffffffffffffb18 =
           (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
            *)&(((_Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)
                &in_RDI[2].
                 super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                )->_M_impl).super__Vector_impl_data._M_finish;
      Tensor::vec(in_stack_fffffffffffffb38);
      Eigen::operator*(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                (&local_298->grads,(ulong)uVar1);
      Tensor::vec(in_stack_fffffffffffffb38);
      Eigen::operator*(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>
      ::operator-(in_stack_fffffffffffffb48,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                   *)in_stack_fffffffffffffb40);
      Tensor::vec(in_stack_fffffffffffffb38);
      Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                ((Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
      Tensor::vec(in_stack_fffffffffffffb38);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
      operator-((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)in_stack_fffffffffffffb48,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
                 *)in_stack_fffffffffffffb40);
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                (&local_298->values,(ulong)uVar1);
      Tensor::vec(in_stack_fffffffffffffb38);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
      operator+=((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)in_stack_fffffffffffffb40,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>
                  *)in_stack_fffffffffffffb38);
      std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++
                ((_Node_iterator<unsigned_int,_true,_false> *)in_stack_fffffffffffffb20);
    }
    LookupParameters::clear(in_stack_fffffffffffffb40);
    __gnu_cxx::
    __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
    ::operator++(&local_288);
  }
  *(float *)&(((_Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)
              &in_RDI[1].
               super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
              )->_M_impl).super__Vector_impl_data._M_end_of_storage =
       *(float *)&(((_Vector_base<cnn::ShadowParameters,_std::allocator<cnn::ShadowParameters>_> *)
                   &in_RDI[1].
                    super__Vector_base<cnn::ShadowLookupParameters,_std::allocator<cnn::ShadowLookupParameters>_>
                   )->_M_impl).super__Vector_impl_data._M_end_of_storage + 1.0;
  return;
}

Assistant:

void MomentumSGDTrainer::update(real scale) {
  // executed on the first iteration to create vectors to
  // store the velocity
  if (!velocity_allocated) {
    vp = AllocateShadowParameters(*model);
    vlp = AllocateShadowLookupParameters(*model);
    velocity_allocated = true;
  }

  const float gscale = clip_gradients();
  unsigned pi = 0;
  for (auto p : model->parameters_list()) {
    Tensor& v = vp[pi++].h;
    auto reg = p->values.vec() * lambda;
    v.vec() = momentum * v.vec() - (eta * scale * gscale) * (p->g.vec());
    p->values.vec() += v.vec() - reg;
    p->clear();
  }
  pi = 0;
  for (auto p : model->lookup_parameters_list()) {
    vector<Tensor>& vx = vlp[pi++].h;
    for (auto i : p->non_zero_grads) {
      Tensor& v = vx[i];
      auto reg = (p->values[i].vec()) * lambda;
      v.vec() = momentum * v.vec() - (eta * scale * gscale) * (p->grads[i].vec());
      p->values[i].vec() += v.vec() - reg;
    }
    p->clear();
  }
  ++updates;
}